

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O0

CKey * __thiscall CKey::operator=(CKey *this,CKey *other)

{
  long lVar1;
  bool bVar2;
  type paVar3;
  type paVar4;
  CKey *in_RSI;
  CKey *in_RDI;
  long in_FS_OFFSET;
  CKey *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI != in_RSI) {
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (bVar2) {
      MakeKeyData(in_RDI);
      paVar3 = std::
               unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ::operator*((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                            *)in_RSI);
      paVar4 = std::
               unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ::operator*((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                            *)in_RSI);
      *(undefined8 *)paVar4->_M_elems = *(undefined8 *)paVar3->_M_elems;
      *(undefined8 *)(paVar4->_M_elems + 8) = *(undefined8 *)(paVar3->_M_elems + 8);
      *(undefined8 *)(paVar4->_M_elems + 0x10) = *(undefined8 *)(paVar3->_M_elems + 0x10);
      *(undefined8 *)(paVar4->_M_elems + 0x18) = *(undefined8 *)(paVar3->_M_elems + 0x18);
    }
    else {
      ClearKeyData(in_stack_ffffffffffffffd8);
    }
    in_RDI->fCompressed = (bool)(in_RSI->fCompressed & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CKey& operator=(const CKey& other)
    {
        if (this != &other) {
            if (other.keydata) {
                MakeKeyData();
                *keydata = *other.keydata;
            } else {
                ClearKeyData();
            }
            fCompressed = other.fCompressed;
        }
        return *this;
    }